

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yescrypt-simd.c
# Opt level: O0

void blockmix_salsa8(salsa20_blk_t *Bin,salsa20_blk_t *Bout,size_t r)

{
  ulong uVar1;
  ulong *puVar2;
  int *piVar3;
  long lVar4;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  ulong uVar39;
  ulong uVar40;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  ulong uVar41;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  __m128i T_55;
  __m128i T_54;
  __m128i T_53;
  __m128i T_52;
  __m128i T_51;
  __m128i T_50;
  __m128i T_49;
  __m128i T_48;
  __m128i T_47;
  __m128i T_46;
  __m128i T_45;
  __m128i T_44;
  __m128i T_43;
  __m128i T_42;
  __m128i T_41;
  __m128i T_40;
  __m128i T_39;
  __m128i T_38;
  __m128i T_37;
  __m128i T_36;
  __m128i T_35;
  __m128i T_34;
  __m128i T_33;
  __m128i T_32;
  __m128i Y3_1;
  __m128i Y2_1;
  __m128i Y1_1;
  __m128i Y0_1;
  __m128i T_31;
  __m128i T_30;
  __m128i T_29;
  __m128i T_28;
  __m128i T_27;
  __m128i T_26;
  __m128i T_25;
  __m128i T_24;
  __m128i T_23;
  __m128i T_22;
  __m128i T_21;
  __m128i T_20;
  __m128i T_19;
  __m128i T_18;
  __m128i T_17;
  __m128i T_16;
  __m128i T_15;
  __m128i T_14;
  __m128i T_13;
  __m128i T_12;
  __m128i T_11;
  __m128i T_10;
  __m128i T_9;
  __m128i T_8;
  __m128i T_7;
  __m128i T_6;
  __m128i T_5;
  __m128i T_4;
  __m128i T_3;
  __m128i T_2;
  __m128i T_1;
  __m128i T;
  __m128i Y3;
  __m128i Y2;
  __m128i Y1;
  __m128i Y0;
  __m128i X3;
  __m128i X2;
  __m128i X1;
  __m128i X0;
  size_t i;
  undefined1 local_2a68 [16];
  undefined1 local_2a58 [16];
  undefined1 local_2a48 [16];
  undefined8 local_2a38;
  undefined8 uStack_2a30;
  ulong local_2a28;
  int local_18e8;
  int iStack_18e4;
  int iStack_18e0;
  int iStack_18dc;
  int local_18c8;
  int iStack_18c4;
  int iStack_18c0;
  int iStack_18bc;
  int local_1898;
  int iStack_1894;
  int iStack_1890;
  int iStack_188c;
  int local_1878;
  int iStack_1874;
  int iStack_1870;
  int iStack_186c;
  int local_1858;
  int iStack_1854;
  int iStack_1850;
  int iStack_184c;
  int local_1838;
  int iStack_1834;
  int iStack_1830;
  int iStack_182c;
  int local_1818;
  int iStack_1814;
  int iStack_1810;
  int iStack_180c;
  int local_17f8;
  int iStack_17f4;
  int iStack_17f0;
  int iStack_17ec;
  int local_17d8;
  int iStack_17d4;
  int iStack_17d0;
  int iStack_17cc;
  int local_17b8;
  int iStack_17b4;
  int iStack_17b0;
  int iStack_17ac;
  int local_1798;
  int iStack_1794;
  int iStack_1790;
  int iStack_178c;
  int local_1778;
  int iStack_1774;
  int iStack_1770;
  int iStack_176c;
  int local_1758;
  int iStack_1754;
  int iStack_1750;
  int iStack_174c;
  int local_1738;
  int iStack_1734;
  int iStack_1730;
  int iStack_172c;
  int local_1718;
  int iStack_1714;
  int iStack_1710;
  int iStack_170c;
  int local_16f8;
  int iStack_16f4;
  int iStack_16f0;
  int iStack_16ec;
  int local_16d8;
  int iStack_16d4;
  int iStack_16d0;
  int iStack_16cc;
  int local_16b8;
  int iStack_16b4;
  int iStack_16b0;
  int iStack_16ac;
  int local_1698;
  int iStack_1694;
  int iStack_1690;
  int iStack_168c;
  int local_1678;
  int iStack_1674;
  int iStack_1670;
  int iStack_166c;
  int local_1658;
  int iStack_1654;
  int iStack_1650;
  int iStack_164c;
  int local_1638;
  int iStack_1634;
  int iStack_1630;
  int iStack_162c;
  int local_1618;
  int iStack_1614;
  int iStack_1610;
  int iStack_160c;
  int local_15f8;
  int iStack_15f4;
  int iStack_15f0;
  int iStack_15ec;
  int local_15d8;
  int iStack_15d4;
  int iStack_15d0;
  int iStack_15cc;
  int local_15b8;
  int iStack_15b4;
  int iStack_15b0;
  int iStack_15ac;
  int local_1598;
  int iStack_1594;
  int iStack_1590;
  int iStack_158c;
  int local_1578;
  int iStack_1574;
  int iStack_1570;
  int iStack_156c;
  int local_1558;
  int iStack_1554;
  int iStack_1550;
  int iStack_154c;
  int local_1538;
  int iStack_1534;
  int iStack_1530;
  int iStack_152c;
  int local_1518;
  int iStack_1514;
  int iStack_1510;
  int iStack_150c;
  int local_14f8;
  int iStack_14f4;
  int iStack_14f0;
  int iStack_14ec;
  int local_14d8;
  int iStack_14d4;
  int iStack_14d0;
  int iStack_14cc;
  int local_14b8;
  int iStack_14b4;
  int iStack_14b0;
  int iStack_14ac;
  int local_14a8;
  int iStack_14a4;
  int iStack_14a0;
  int iStack_149c;
  int local_1498;
  int iStack_1494;
  int iStack_1490;
  int iStack_148c;
  int local_1468;
  int iStack_1464;
  int iStack_1460;
  int iStack_145c;
  int local_1448;
  int iStack_1444;
  int iStack_1440;
  int iStack_143c;
  int local_1418;
  int iStack_1414;
  int iStack_1410;
  int iStack_140c;
  int local_13f8;
  int iStack_13f4;
  int iStack_13f0;
  int iStack_13ec;
  int local_13d8;
  int iStack_13d4;
  int iStack_13d0;
  int iStack_13cc;
  int local_13b8;
  int iStack_13b4;
  int iStack_13b0;
  int iStack_13ac;
  int local_1398;
  int iStack_1394;
  int iStack_1390;
  int iStack_138c;
  int local_1378;
  int iStack_1374;
  int iStack_1370;
  int iStack_136c;
  int local_1358;
  int iStack_1354;
  int iStack_1350;
  int iStack_134c;
  int local_1338;
  int iStack_1334;
  int iStack_1330;
  int iStack_132c;
  int local_1318;
  int iStack_1314;
  int iStack_1310;
  int iStack_130c;
  int local_12f8;
  int iStack_12f4;
  int iStack_12f0;
  int iStack_12ec;
  int local_12d8;
  int iStack_12d4;
  int iStack_12d0;
  int iStack_12cc;
  int local_12b8;
  int iStack_12b4;
  int iStack_12b0;
  int iStack_12ac;
  int local_1298;
  int iStack_1294;
  int iStack_1290;
  int iStack_128c;
  int local_1278;
  int iStack_1274;
  int iStack_1270;
  int iStack_126c;
  int local_1258;
  int iStack_1254;
  int iStack_1250;
  int iStack_124c;
  int local_1238;
  int iStack_1234;
  int iStack_1230;
  int iStack_122c;
  int local_1218;
  int iStack_1214;
  int iStack_1210;
  int iStack_120c;
  int local_11f8;
  int iStack_11f4;
  int iStack_11f0;
  int iStack_11ec;
  int local_11d8;
  int iStack_11d4;
  int iStack_11d0;
  int iStack_11cc;
  int local_11b8;
  int iStack_11b4;
  int iStack_11b0;
  int iStack_11ac;
  int local_1198;
  int iStack_1194;
  int iStack_1190;
  int iStack_118c;
  int local_1178;
  int iStack_1174;
  int iStack_1170;
  int iStack_116c;
  int local_1158;
  int iStack_1154;
  int iStack_1150;
  int iStack_114c;
  int local_1138;
  int iStack_1134;
  int iStack_1130;
  int iStack_112c;
  int local_1118;
  int iStack_1114;
  int iStack_1110;
  int iStack_110c;
  int local_10f8;
  int iStack_10f4;
  int iStack_10f0;
  int iStack_10ec;
  int local_10d8;
  int iStack_10d4;
  int iStack_10d0;
  int iStack_10cc;
  int local_10b8;
  int iStack_10b4;
  int iStack_10b0;
  int iStack_10ac;
  int local_1098;
  int iStack_1094;
  int iStack_1090;
  int iStack_108c;
  int local_1078;
  int iStack_1074;
  int iStack_1070;
  int iStack_106c;
  int local_1058;
  int iStack_1054;
  int iStack_1050;
  int iStack_104c;
  int local_1038;
  int iStack_1034;
  int iStack_1030;
  int iStack_102c;
  int local_1028;
  int iStack_1024;
  int iStack_1020;
  int iStack_101c;
  int local_1018;
  int iStack_1014;
  int iStack_1010;
  int iStack_100c;
  __m128i T_63;
  __m128i T_62;
  __m128i T_61;
  __m128i T_60;
  __m128i T_59;
  __m128i T_58;
  __m128i T_57;
  __m128i T_56;
  
  uVar1 = in_RDX - 1;
  for (local_2a28 = 0; local_2a28 < uVar1; local_2a28 = local_2a28 + 1) {
  }
  puVar2 = (ulong *)(in_RDI + (uVar1 * 2 + 1) * 0x40);
  local_2a38 = *puVar2;
  uStack_2a30 = puVar2[1];
  local_2a48 = *(undefined1 (*) [16])(in_RDI + (uVar1 * 2 + 1) * 0x40 + 0x10);
  local_2a58 = *(undefined1 (*) [16])(in_RDI + (uVar1 * 2 + 1) * 0x40 + 0x20);
  local_2a68 = *(undefined1 (*) [16])(in_RDI + (uVar1 * 2 + 1) * 0x40 + 0x30);
  for (local_2a28 = 0; local_2a28 <= uVar1; local_2a28 = local_2a28 + 1) {
    puVar2 = (ulong *)(in_RDI + local_2a28 * 0x80);
    local_2a38 = local_2a38 ^ *puVar2;
    uStack_2a30 = uStack_2a30 ^ puVar2[1];
    puVar2 = (ulong *)(in_RDI + 0x10 + local_2a28 * 0x80);
    uVar5 = local_2a48._0_8_ ^ *puVar2;
    uVar36 = local_2a48._8_8_ ^ puVar2[1];
    puVar2 = (ulong *)(in_RDI + 0x20 + local_2a28 * 0x80);
    uVar6 = local_2a58._0_8_ ^ *puVar2;
    uVar37 = local_2a58._8_8_ ^ puVar2[1];
    puVar2 = (ulong *)(in_RDI + 0x30 + local_2a28 * 0x80);
    local_2a68._0_8_ = local_2a68._0_8_ ^ *puVar2;
    local_2a68._8_8_ = local_2a68._8_8_ ^ puVar2[1];
    local_1018 = (int)local_2a38;
    iStack_1014 = (int)(local_2a38 >> 0x20);
    iStack_1010 = (int)uStack_2a30;
    iStack_100c = (int)(uStack_2a30 >> 0x20);
    local_1028 = (int)local_2a68._0_8_;
    iStack_1024 = (int)((ulong)local_2a68._0_8_ >> 0x20);
    iStack_1020 = (int)local_2a68._8_8_;
    iStack_101c = (int)((ulong)local_2a68._8_8_ >> 0x20);
    uVar7 = uVar5 ^ CONCAT44(iStack_1014 + iStack_1024,(local_1018 + local_1028) * 0x80) ^
            CONCAT44((uint)(iStack_1014 + iStack_1024) >> 0x19,
                     (uint)(local_1018 + local_1028) >> 0x19);
    uVar38 = uVar36 ^ CONCAT44(iStack_100c + iStack_101c,iStack_1010 + iStack_1020) ^
             CONCAT44((uint)(iStack_100c + iStack_101c) >> 0x19,
                      (uint)(iStack_1010 + iStack_1020) >> 0x19);
    local_1038 = (int)uVar7;
    iStack_1034 = (int)(uVar7 >> 0x20);
    iStack_1030 = (int)uVar38;
    iStack_102c = (int)(uVar38 >> 0x20);
    uVar7 = uVar6 ^ CONCAT44(iStack_1034 + iStack_1014,(local_1038 + local_1018) * 0x200) ^
            CONCAT44((uint)(iStack_1034 + iStack_1014) >> 0x17,
                     (uint)(local_1038 + local_1018) >> 0x17);
    uVar39 = uVar37 ^ CONCAT44(iStack_102c + iStack_100c,iStack_1030 + iStack_1010) ^
             CONCAT44((uint)(iStack_102c + iStack_100c) >> 0x17,
                      (uint)(iStack_1030 + iStack_1010) >> 0x17);
    local_1058 = (int)uVar7;
    iStack_1054 = (int)(uVar7 >> 0x20);
    iStack_1050 = (int)uVar39;
    iStack_104c = (int)(uVar39 >> 0x20);
    local_2a68._0_8_ =
         local_2a68._0_8_ ^ CONCAT44(iStack_1054 + iStack_1034,(local_1058 + local_1038) * 0x2000) ^
         CONCAT44((uint)(iStack_1054 + iStack_1034) >> 0x13,(uint)(local_1058 + local_1038) >> 0x13)
    ;
    local_2a68._8_8_ =
         local_2a68._8_8_ ^ CONCAT44(iStack_104c + iStack_102c,iStack_1050 + iStack_1030) ^
         CONCAT44((uint)(iStack_104c + iStack_102c) >> 0x13,
                  (uint)(iStack_1050 + iStack_1030) >> 0x13);
    local_1078 = (int)local_2a68._0_8_;
    iStack_1074 = (int)((ulong)local_2a68._0_8_ >> 0x20);
    iStack_1070 = (int)local_2a68._8_8_;
    iStack_106c = (int)((ulong)local_2a68._8_8_ >> 0x20);
    uVar7 = local_2a38 ^ CONCAT44(iStack_1074 + iStack_1054,(local_1078 + local_1058) * 0x40000) ^
            CONCAT44((uint)(iStack_1074 + iStack_1054) >> 0xe,(uint)(local_1078 + local_1058) >> 0xe
                    );
    uVar40 = uStack_2a30 ^ CONCAT44(iStack_106c + iStack_104c,iStack_1070 + iStack_1050) ^
             CONCAT44((uint)(iStack_106c + iStack_104c) >> 0xe,
                      (uint)(iStack_1070 + iStack_1050) >> 0xe);
    local_2a48._4_4_ = local_1038;
    local_2a48._0_4_ = iStack_102c;
    local_2a48._8_4_ = iStack_1034;
    local_2a48._12_4_ = iStack_1030;
    auVar8._8_4_ = local_1058;
    auVar8._0_8_ = uVar39;
    auVar8._12_4_ = iStack_1054;
    auVar9._0_12_ = local_2a68._4_12_;
    auVar9._12_4_ = local_1078;
    local_1098 = (int)uVar7;
    iStack_1094 = (int)(uVar7 >> 0x20);
    iStack_1090 = (int)uVar40;
    iStack_108c = (int)(uVar40 >> 0x20);
    local_2a68._0_8_ = local_2a68._4_8_;
    local_2a68._8_8_ = auVar9._8_8_;
    uVar38 = local_2a68._0_8_ ^ CONCAT44(iStack_1094 + local_1038,(local_1098 + iStack_102c) * 0x80)
             ^ CONCAT44((uint)(iStack_1094 + local_1038) >> 0x19,
                        (uint)(local_1098 + iStack_102c) >> 0x19);
    uVar41 = local_2a68._8_8_ ^ CONCAT44(iStack_108c + iStack_1030,iStack_1090 + iStack_1034) ^
             CONCAT44((uint)(iStack_108c + iStack_1030) >> 0x19,
                      (uint)(iStack_1090 + iStack_1034) >> 0x19);
    local_10b8 = (int)uVar38;
    iStack_10b4 = (int)(uVar38 >> 0x20);
    iStack_10b0 = (int)uVar41;
    iStack_10ac = (int)(uVar41 >> 0x20);
    local_2a58._8_8_ = auVar8._8_8_;
    uVar38 = uVar39 ^ CONCAT44(iStack_10b4 + iStack_1094,(local_10b8 + local_1098) * 0x200) ^
             CONCAT44((uint)(iStack_10b4 + iStack_1094) >> 0x17,
                      (uint)(local_10b8 + local_1098) >> 0x17);
    uVar39 = local_2a58._8_8_ ^ CONCAT44(iStack_10ac + iStack_108c,iStack_10b0 + iStack_1090) ^
             CONCAT44((uint)(iStack_10ac + iStack_108c) >> 0x17,
                      (uint)(iStack_10b0 + iStack_1090) >> 0x17);
    local_10d8 = (int)uVar38;
    iStack_10d4 = (int)(uVar38 >> 0x20);
    iStack_10d0 = (int)uVar39;
    iStack_10cc = (int)(uVar39 >> 0x20);
    local_2a48._0_8_ =
         local_2a48._0_8_ ^ CONCAT44(iStack_10d4 + iStack_10b4,(local_10d8 + local_10b8) * 0x2000) ^
         CONCAT44((uint)(iStack_10d4 + iStack_10b4) >> 0x13,(uint)(local_10d8 + local_10b8) >> 0x13)
    ;
    local_2a48._8_8_ =
         local_2a48._8_8_ ^ CONCAT44(iStack_10cc + iStack_10ac,iStack_10d0 + iStack_10b0) ^
         CONCAT44((uint)(iStack_10cc + iStack_10ac) >> 0x13,
                  (uint)(iStack_10d0 + iStack_10b0) >> 0x13);
    local_10f8 = (int)local_2a48._0_8_;
    iStack_10f4 = (int)((ulong)local_2a48._0_8_ >> 0x20);
    iStack_10f0 = (int)local_2a48._8_8_;
    iStack_10ec = (int)((ulong)local_2a48._8_8_ >> 0x20);
    uVar7 = uVar7 ^ CONCAT44(iStack_10f4 + iStack_10d4,(local_10f8 + local_10d8) * 0x40000) ^
            CONCAT44((uint)(iStack_10f4 + iStack_10d4) >> 0xe,(uint)(local_10f8 + local_10d8) >> 0xe
                    );
    uVar40 = uVar40 ^ CONCAT44(iStack_10ec + iStack_10cc,iStack_10f0 + iStack_10d0) ^
             CONCAT44((uint)(iStack_10ec + iStack_10cc) >> 0xe,
                      (uint)(iStack_10f0 + iStack_10d0) >> 0xe);
    auVar10._0_12_ = local_2a48._4_12_;
    auVar10._12_4_ = local_10f8;
    auVar11._8_4_ = local_10d8;
    auVar11._0_8_ = uVar39;
    auVar11._12_4_ = iStack_10d4;
    local_2a68._4_4_ = local_10b8;
    local_2a68._0_4_ = iStack_10ac;
    local_2a68._8_4_ = iStack_10b4;
    local_2a68._12_4_ = iStack_10b0;
    local_1118 = (int)uVar7;
    iStack_1114 = (int)(uVar7 >> 0x20);
    iStack_1110 = (int)uVar40;
    iStack_110c = (int)(uVar40 >> 0x20);
    local_2a48._0_8_ = local_2a48._4_8_;
    local_2a48._8_8_ = auVar10._8_8_;
    uVar38 = local_2a48._0_8_ ^ CONCAT44(iStack_1114 + local_10b8,(local_1118 + iStack_10ac) * 0x80)
             ^ CONCAT44((uint)(iStack_1114 + local_10b8) >> 0x19,
                        (uint)(local_1118 + iStack_10ac) >> 0x19);
    uVar41 = local_2a48._8_8_ ^ CONCAT44(iStack_110c + iStack_10b0,iStack_1110 + iStack_10b4) ^
             CONCAT44((uint)(iStack_110c + iStack_10b0) >> 0x19,
                      (uint)(iStack_1110 + iStack_10b4) >> 0x19);
    local_1138 = (int)uVar38;
    iStack_1134 = (int)(uVar38 >> 0x20);
    iStack_1130 = (int)uVar41;
    iStack_112c = (int)(uVar41 >> 0x20);
    local_2a58._8_8_ = auVar11._8_8_;
    uVar38 = uVar39 ^ CONCAT44(iStack_1134 + iStack_1114,(local_1138 + local_1118) * 0x200) ^
             CONCAT44((uint)(iStack_1134 + iStack_1114) >> 0x17,
                      (uint)(local_1138 + local_1118) >> 0x17);
    uVar39 = local_2a58._8_8_ ^ CONCAT44(iStack_112c + iStack_110c,iStack_1130 + iStack_1110) ^
             CONCAT44((uint)(iStack_112c + iStack_110c) >> 0x17,
                      (uint)(iStack_1130 + iStack_1110) >> 0x17);
    local_1158 = (int)uVar38;
    iStack_1154 = (int)(uVar38 >> 0x20);
    iStack_1150 = (int)uVar39;
    iStack_114c = (int)(uVar39 >> 0x20);
    local_2a68._0_8_ =
         local_2a68._0_8_ ^ CONCAT44(iStack_1154 + iStack_1134,(local_1158 + local_1138) * 0x2000) ^
         CONCAT44((uint)(iStack_1154 + iStack_1134) >> 0x13,(uint)(local_1158 + local_1138) >> 0x13)
    ;
    local_2a68._8_8_ =
         local_2a68._8_8_ ^ CONCAT44(iStack_114c + iStack_112c,iStack_1150 + iStack_1130) ^
         CONCAT44((uint)(iStack_114c + iStack_112c) >> 0x13,
                  (uint)(iStack_1150 + iStack_1130) >> 0x13);
    local_1178 = (int)local_2a68._0_8_;
    iStack_1174 = (int)((ulong)local_2a68._0_8_ >> 0x20);
    iStack_1170 = (int)local_2a68._8_8_;
    iStack_116c = (int)((ulong)local_2a68._8_8_ >> 0x20);
    uVar7 = uVar7 ^ CONCAT44(iStack_1174 + iStack_1154,(local_1178 + local_1158) * 0x40000) ^
            CONCAT44((uint)(iStack_1174 + iStack_1154) >> 0xe,(uint)(local_1178 + local_1158) >> 0xe
                    );
    uVar40 = uVar40 ^ CONCAT44(iStack_116c + iStack_114c,iStack_1170 + iStack_1150) ^
             CONCAT44((uint)(iStack_116c + iStack_114c) >> 0xe,
                      (uint)(iStack_1170 + iStack_1150) >> 0xe);
    local_2a48._4_4_ = local_1138;
    local_2a48._0_4_ = iStack_112c;
    local_2a48._8_4_ = iStack_1134;
    local_2a48._12_4_ = iStack_1130;
    auVar12._8_4_ = local_1158;
    auVar12._0_8_ = uVar39;
    auVar12._12_4_ = iStack_1154;
    auVar13._0_12_ = local_2a68._4_12_;
    auVar13._12_4_ = local_1178;
    local_1198 = (int)uVar7;
    iStack_1194 = (int)(uVar7 >> 0x20);
    iStack_1190 = (int)uVar40;
    iStack_118c = (int)(uVar40 >> 0x20);
    local_2a68._0_8_ = local_2a68._4_8_;
    local_2a68._8_8_ = auVar13._8_8_;
    uVar38 = local_2a68._0_8_ ^ CONCAT44(iStack_1194 + local_1138,(local_1198 + iStack_112c) * 0x80)
             ^ CONCAT44((uint)(iStack_1194 + local_1138) >> 0x19,
                        (uint)(local_1198 + iStack_112c) >> 0x19);
    uVar41 = local_2a68._8_8_ ^ CONCAT44(iStack_118c + iStack_1130,iStack_1190 + iStack_1134) ^
             CONCAT44((uint)(iStack_118c + iStack_1130) >> 0x19,
                      (uint)(iStack_1190 + iStack_1134) >> 0x19);
    local_11b8 = (int)uVar38;
    iStack_11b4 = (int)(uVar38 >> 0x20);
    iStack_11b0 = (int)uVar41;
    iStack_11ac = (int)(uVar41 >> 0x20);
    local_2a58._8_8_ = auVar12._8_8_;
    uVar38 = uVar39 ^ CONCAT44(iStack_11b4 + iStack_1194,(local_11b8 + local_1198) * 0x200) ^
             CONCAT44((uint)(iStack_11b4 + iStack_1194) >> 0x17,
                      (uint)(local_11b8 + local_1198) >> 0x17);
    uVar39 = local_2a58._8_8_ ^ CONCAT44(iStack_11ac + iStack_118c,iStack_11b0 + iStack_1190) ^
             CONCAT44((uint)(iStack_11ac + iStack_118c) >> 0x17,
                      (uint)(iStack_11b0 + iStack_1190) >> 0x17);
    local_11d8 = (int)uVar38;
    iStack_11d4 = (int)(uVar38 >> 0x20);
    iStack_11d0 = (int)uVar39;
    iStack_11cc = (int)(uVar39 >> 0x20);
    local_2a48._0_8_ =
         local_2a48._0_8_ ^ CONCAT44(iStack_11d4 + iStack_11b4,(local_11d8 + local_11b8) * 0x2000) ^
         CONCAT44((uint)(iStack_11d4 + iStack_11b4) >> 0x13,(uint)(local_11d8 + local_11b8) >> 0x13)
    ;
    local_2a48._8_8_ =
         local_2a48._8_8_ ^ CONCAT44(iStack_11cc + iStack_11ac,iStack_11d0 + iStack_11b0) ^
         CONCAT44((uint)(iStack_11cc + iStack_11ac) >> 0x13,
                  (uint)(iStack_11d0 + iStack_11b0) >> 0x13);
    local_11f8 = (int)local_2a48._0_8_;
    iStack_11f4 = (int)((ulong)local_2a48._0_8_ >> 0x20);
    iStack_11f0 = (int)local_2a48._8_8_;
    iStack_11ec = (int)((ulong)local_2a48._8_8_ >> 0x20);
    uVar7 = uVar7 ^ CONCAT44(iStack_11f4 + iStack_11d4,(local_11f8 + local_11d8) * 0x40000) ^
            CONCAT44((uint)(iStack_11f4 + iStack_11d4) >> 0xe,(uint)(local_11f8 + local_11d8) >> 0xe
                    );
    uVar40 = uVar40 ^ CONCAT44(iStack_11ec + iStack_11cc,iStack_11f0 + iStack_11d0) ^
             CONCAT44((uint)(iStack_11ec + iStack_11cc) >> 0xe,
                      (uint)(iStack_11f0 + iStack_11d0) >> 0xe);
    auVar14._0_12_ = local_2a48._4_12_;
    auVar14._12_4_ = local_11f8;
    auVar15._8_4_ = local_11d8;
    auVar15._0_8_ = uVar39;
    auVar15._12_4_ = iStack_11d4;
    local_2a68._4_4_ = local_11b8;
    local_2a68._0_4_ = iStack_11ac;
    local_2a68._8_4_ = iStack_11b4;
    local_2a68._12_4_ = iStack_11b0;
    local_1218 = (int)uVar7;
    iStack_1214 = (int)(uVar7 >> 0x20);
    iStack_1210 = (int)uVar40;
    iStack_120c = (int)(uVar40 >> 0x20);
    local_2a48._0_8_ = local_2a48._4_8_;
    local_2a48._8_8_ = auVar14._8_8_;
    uVar38 = local_2a48._0_8_ ^ CONCAT44(iStack_1214 + local_11b8,(local_1218 + iStack_11ac) * 0x80)
             ^ CONCAT44((uint)(iStack_1214 + local_11b8) >> 0x19,
                        (uint)(local_1218 + iStack_11ac) >> 0x19);
    uVar41 = local_2a48._8_8_ ^ CONCAT44(iStack_120c + iStack_11b0,iStack_1210 + iStack_11b4) ^
             CONCAT44((uint)(iStack_120c + iStack_11b0) >> 0x19,
                      (uint)(iStack_1210 + iStack_11b4) >> 0x19);
    local_1238 = (int)uVar38;
    iStack_1234 = (int)(uVar38 >> 0x20);
    iStack_1230 = (int)uVar41;
    iStack_122c = (int)(uVar41 >> 0x20);
    local_2a58._8_8_ = auVar15._8_8_;
    uVar38 = uVar39 ^ CONCAT44(iStack_1234 + iStack_1214,(local_1238 + local_1218) * 0x200) ^
             CONCAT44((uint)(iStack_1234 + iStack_1214) >> 0x17,
                      (uint)(local_1238 + local_1218) >> 0x17);
    uVar39 = local_2a58._8_8_ ^ CONCAT44(iStack_122c + iStack_120c,iStack_1230 + iStack_1210) ^
             CONCAT44((uint)(iStack_122c + iStack_120c) >> 0x17,
                      (uint)(iStack_1230 + iStack_1210) >> 0x17);
    local_1258 = (int)uVar38;
    iStack_1254 = (int)(uVar38 >> 0x20);
    iStack_1250 = (int)uVar39;
    iStack_124c = (int)(uVar39 >> 0x20);
    local_2a68._0_8_ =
         local_2a68._0_8_ ^ CONCAT44(iStack_1254 + iStack_1234,(local_1258 + local_1238) * 0x2000) ^
         CONCAT44((uint)(iStack_1254 + iStack_1234) >> 0x13,(uint)(local_1258 + local_1238) >> 0x13)
    ;
    local_2a68._8_8_ =
         local_2a68._8_8_ ^ CONCAT44(iStack_124c + iStack_122c,iStack_1250 + iStack_1230) ^
         CONCAT44((uint)(iStack_124c + iStack_122c) >> 0x13,
                  (uint)(iStack_1250 + iStack_1230) >> 0x13);
    local_1278 = (int)local_2a68._0_8_;
    iStack_1274 = (int)((ulong)local_2a68._0_8_ >> 0x20);
    iStack_1270 = (int)local_2a68._8_8_;
    iStack_126c = (int)((ulong)local_2a68._8_8_ >> 0x20);
    uVar7 = uVar7 ^ CONCAT44(iStack_1274 + iStack_1254,(local_1278 + local_1258) * 0x40000) ^
            CONCAT44((uint)(iStack_1274 + iStack_1254) >> 0xe,(uint)(local_1278 + local_1258) >> 0xe
                    );
    uVar40 = uVar40 ^ CONCAT44(iStack_126c + iStack_124c,iStack_1270 + iStack_1250) ^
             CONCAT44((uint)(iStack_126c + iStack_124c) >> 0xe,
                      (uint)(iStack_1270 + iStack_1250) >> 0xe);
    local_2a48._4_4_ = local_1238;
    local_2a48._0_4_ = iStack_122c;
    local_2a48._8_4_ = iStack_1234;
    local_2a48._12_4_ = iStack_1230;
    auVar16._8_4_ = local_1258;
    auVar16._0_8_ = uVar39;
    auVar16._12_4_ = iStack_1254;
    auVar17._0_12_ = local_2a68._4_12_;
    auVar17._12_4_ = local_1278;
    local_1298 = (int)uVar7;
    iStack_1294 = (int)(uVar7 >> 0x20);
    iStack_1290 = (int)uVar40;
    iStack_128c = (int)(uVar40 >> 0x20);
    local_2a68._0_8_ = local_2a68._4_8_;
    local_2a68._8_8_ = auVar17._8_8_;
    uVar38 = local_2a68._0_8_ ^ CONCAT44(iStack_1294 + local_1238,(local_1298 + iStack_122c) * 0x80)
             ^ CONCAT44((uint)(iStack_1294 + local_1238) >> 0x19,
                        (uint)(local_1298 + iStack_122c) >> 0x19);
    uVar41 = local_2a68._8_8_ ^ CONCAT44(iStack_128c + iStack_1230,iStack_1290 + iStack_1234) ^
             CONCAT44((uint)(iStack_128c + iStack_1230) >> 0x19,
                      (uint)(iStack_1290 + iStack_1234) >> 0x19);
    local_12b8 = (int)uVar38;
    iStack_12b4 = (int)(uVar38 >> 0x20);
    iStack_12b0 = (int)uVar41;
    iStack_12ac = (int)(uVar41 >> 0x20);
    local_2a58._8_8_ = auVar16._8_8_;
    uVar38 = uVar39 ^ CONCAT44(iStack_12b4 + iStack_1294,(local_12b8 + local_1298) * 0x200) ^
             CONCAT44((uint)(iStack_12b4 + iStack_1294) >> 0x17,
                      (uint)(local_12b8 + local_1298) >> 0x17);
    uVar39 = local_2a58._8_8_ ^ CONCAT44(iStack_12ac + iStack_128c,iStack_12b0 + iStack_1290) ^
             CONCAT44((uint)(iStack_12ac + iStack_128c) >> 0x17,
                      (uint)(iStack_12b0 + iStack_1290) >> 0x17);
    local_12d8 = (int)uVar38;
    iStack_12d4 = (int)(uVar38 >> 0x20);
    iStack_12d0 = (int)uVar39;
    iStack_12cc = (int)(uVar39 >> 0x20);
    local_2a48._0_8_ =
         local_2a48._0_8_ ^ CONCAT44(iStack_12d4 + iStack_12b4,(local_12d8 + local_12b8) * 0x2000) ^
         CONCAT44((uint)(iStack_12d4 + iStack_12b4) >> 0x13,(uint)(local_12d8 + local_12b8) >> 0x13)
    ;
    local_2a48._8_8_ =
         local_2a48._8_8_ ^ CONCAT44(iStack_12cc + iStack_12ac,iStack_12d0 + iStack_12b0) ^
         CONCAT44((uint)(iStack_12cc + iStack_12ac) >> 0x13,
                  (uint)(iStack_12d0 + iStack_12b0) >> 0x13);
    local_12f8 = (int)local_2a48._0_8_;
    iStack_12f4 = (int)((ulong)local_2a48._0_8_ >> 0x20);
    iStack_12f0 = (int)local_2a48._8_8_;
    iStack_12ec = (int)((ulong)local_2a48._8_8_ >> 0x20);
    uVar7 = uVar7 ^ CONCAT44(iStack_12f4 + iStack_12d4,(local_12f8 + local_12d8) * 0x40000) ^
            CONCAT44((uint)(iStack_12f4 + iStack_12d4) >> 0xe,(uint)(local_12f8 + local_12d8) >> 0xe
                    );
    uVar40 = uVar40 ^ CONCAT44(iStack_12ec + iStack_12cc,iStack_12f0 + iStack_12d0) ^
             CONCAT44((uint)(iStack_12ec + iStack_12cc) >> 0xe,
                      (uint)(iStack_12f0 + iStack_12d0) >> 0xe);
    auVar18._0_12_ = local_2a48._4_12_;
    auVar18._12_4_ = local_12f8;
    auVar19._8_4_ = local_12d8;
    auVar19._0_8_ = uVar39;
    auVar19._12_4_ = iStack_12d4;
    local_2a68._4_4_ = local_12b8;
    local_2a68._0_4_ = iStack_12ac;
    local_2a68._8_4_ = iStack_12b4;
    local_2a68._12_4_ = iStack_12b0;
    local_1318 = (int)uVar7;
    iStack_1314 = (int)(uVar7 >> 0x20);
    iStack_1310 = (int)uVar40;
    iStack_130c = (int)(uVar40 >> 0x20);
    local_2a48._0_8_ = local_2a48._4_8_;
    local_2a48._8_8_ = auVar18._8_8_;
    uVar38 = local_2a48._0_8_ ^ CONCAT44(iStack_1314 + local_12b8,(local_1318 + iStack_12ac) * 0x80)
             ^ CONCAT44((uint)(iStack_1314 + local_12b8) >> 0x19,
                        (uint)(local_1318 + iStack_12ac) >> 0x19);
    uVar41 = local_2a48._8_8_ ^ CONCAT44(iStack_130c + iStack_12b0,iStack_1310 + iStack_12b4) ^
             CONCAT44((uint)(iStack_130c + iStack_12b0) >> 0x19,
                      (uint)(iStack_1310 + iStack_12b4) >> 0x19);
    local_1338 = (int)uVar38;
    iStack_1334 = (int)(uVar38 >> 0x20);
    iStack_1330 = (int)uVar41;
    iStack_132c = (int)(uVar41 >> 0x20);
    local_2a58._8_8_ = auVar19._8_8_;
    uVar38 = uVar39 ^ CONCAT44(iStack_1334 + iStack_1314,(local_1338 + local_1318) * 0x200) ^
             CONCAT44((uint)(iStack_1334 + iStack_1314) >> 0x17,
                      (uint)(local_1338 + local_1318) >> 0x17);
    uVar39 = local_2a58._8_8_ ^ CONCAT44(iStack_132c + iStack_130c,iStack_1330 + iStack_1310) ^
             CONCAT44((uint)(iStack_132c + iStack_130c) >> 0x17,
                      (uint)(iStack_1330 + iStack_1310) >> 0x17);
    local_1358 = (int)uVar38;
    iStack_1354 = (int)(uVar38 >> 0x20);
    iStack_1350 = (int)uVar39;
    iStack_134c = (int)(uVar39 >> 0x20);
    local_2a68._0_8_ =
         local_2a68._0_8_ ^ CONCAT44(iStack_1354 + iStack_1334,(local_1358 + local_1338) * 0x2000) ^
         CONCAT44((uint)(iStack_1354 + iStack_1334) >> 0x13,(uint)(local_1358 + local_1338) >> 0x13)
    ;
    local_2a68._8_8_ =
         local_2a68._8_8_ ^ CONCAT44(iStack_134c + iStack_132c,iStack_1350 + iStack_1330) ^
         CONCAT44((uint)(iStack_134c + iStack_132c) >> 0x13,
                  (uint)(iStack_1350 + iStack_1330) >> 0x13);
    local_1378 = (int)local_2a68._0_8_;
    iStack_1374 = (int)((ulong)local_2a68._0_8_ >> 0x20);
    iStack_1370 = (int)local_2a68._8_8_;
    iStack_136c = (int)((ulong)local_2a68._8_8_ >> 0x20);
    uVar7 = uVar7 ^ CONCAT44(iStack_1374 + iStack_1354,(local_1378 + local_1358) * 0x40000) ^
            CONCAT44((uint)(iStack_1374 + iStack_1354) >> 0xe,(uint)(local_1378 + local_1358) >> 0xe
                    );
    uVar40 = uVar40 ^ CONCAT44(iStack_136c + iStack_134c,iStack_1370 + iStack_1350) ^
             CONCAT44((uint)(iStack_136c + iStack_134c) >> 0xe,
                      (uint)(iStack_1370 + iStack_1350) >> 0xe);
    local_2a48._4_4_ = local_1338;
    local_2a48._0_4_ = iStack_132c;
    local_2a48._8_4_ = iStack_1334;
    local_2a48._12_4_ = iStack_1330;
    auVar20._8_4_ = local_1358;
    auVar20._0_8_ = uVar39;
    auVar20._12_4_ = iStack_1354;
    auVar21._0_12_ = local_2a68._4_12_;
    auVar21._12_4_ = local_1378;
    local_1398 = (int)uVar7;
    iStack_1394 = (int)(uVar7 >> 0x20);
    iStack_1390 = (int)uVar40;
    iStack_138c = (int)(uVar40 >> 0x20);
    local_2a68._0_8_ = local_2a68._4_8_;
    local_2a68._8_8_ = auVar21._8_8_;
    uVar38 = local_2a68._0_8_ ^ CONCAT44(iStack_1394 + local_1338,(local_1398 + iStack_132c) * 0x80)
             ^ CONCAT44((uint)(iStack_1394 + local_1338) >> 0x19,
                        (uint)(local_1398 + iStack_132c) >> 0x19);
    uVar41 = local_2a68._8_8_ ^ CONCAT44(iStack_138c + iStack_1330,iStack_1390 + iStack_1334) ^
             CONCAT44((uint)(iStack_138c + iStack_1330) >> 0x19,
                      (uint)(iStack_1390 + iStack_1334) >> 0x19);
    local_13b8 = (int)uVar38;
    iStack_13b4 = (int)(uVar38 >> 0x20);
    iStack_13b0 = (int)uVar41;
    iStack_13ac = (int)(uVar41 >> 0x20);
    local_2a58._8_8_ = auVar20._8_8_;
    uVar38 = uVar39 ^ CONCAT44(iStack_13b4 + iStack_1394,(local_13b8 + local_1398) * 0x200) ^
             CONCAT44((uint)(iStack_13b4 + iStack_1394) >> 0x17,
                      (uint)(local_13b8 + local_1398) >> 0x17);
    uVar39 = local_2a58._8_8_ ^ CONCAT44(iStack_13ac + iStack_138c,iStack_13b0 + iStack_1390) ^
             CONCAT44((uint)(iStack_13ac + iStack_138c) >> 0x17,
                      (uint)(iStack_13b0 + iStack_1390) >> 0x17);
    local_13d8 = (int)uVar38;
    iStack_13d4 = (int)(uVar38 >> 0x20);
    iStack_13d0 = (int)uVar39;
    iStack_13cc = (int)(uVar39 >> 0x20);
    uVar38 = local_2a48._0_8_ ^
             CONCAT44(iStack_13d4 + iStack_13b4,(local_13d8 + local_13b8) * 0x2000) ^
             CONCAT44((uint)(iStack_13d4 + iStack_13b4) >> 0x13,
                      (uint)(local_13d8 + local_13b8) >> 0x13);
    uVar39 = local_2a48._8_8_ ^ CONCAT44(iStack_13cc + iStack_13ac,iStack_13d0 + iStack_13b0) ^
             CONCAT44((uint)(iStack_13cc + iStack_13ac) >> 0x13,
                      (uint)(iStack_13d0 + iStack_13b0) >> 0x13);
    local_13f8 = (int)uVar38;
    iStack_13f4 = (int)(uVar38 >> 0x20);
    iStack_13f0 = (int)uVar39;
    iStack_13ec = (int)(uVar39 >> 0x20);
    uVar7 = uVar7 ^ CONCAT44(iStack_13f4 + iStack_13d4,(local_13f8 + local_13d8) * 0x40000) ^
            CONCAT44((uint)(iStack_13f4 + iStack_13d4) >> 0xe,(uint)(local_13f8 + local_13d8) >> 0xe
                    );
    uVar38 = uVar40 ^ CONCAT44(iStack_13ec + iStack_13cc,iStack_13f0 + iStack_13d0) ^
             CONCAT44((uint)(iStack_13ec + iStack_13cc) >> 0xe,
                      (uint)(iStack_13f0 + iStack_13d0) >> 0xe);
    local_1418 = (int)uVar7;
    iStack_1414 = (int)(uVar7 >> 0x20);
    iStack_1410 = (int)uVar38;
    iStack_140c = (int)(uVar38 >> 0x20);
    local_2a38 = CONCAT44(iStack_1414 + iStack_1014,local_1418 + local_1018);
    uStack_2a30 = CONCAT44(iStack_140c + iStack_100c,iStack_1410 + iStack_1010);
    piVar3 = (int *)(in_RSI + local_2a28 * 0x40);
    *piVar3 = local_1418 + local_1018;
    piVar3[1] = iStack_1414 + iStack_1014;
    piVar3[2] = iStack_1410 + iStack_1010;
    piVar3[3] = iStack_140c + iStack_100c;
    local_1448 = (int)uVar5;
    iStack_1444 = (int)(uVar5 >> 0x20);
    iStack_1440 = (int)uVar36;
    iStack_143c = (int)(uVar36 >> 0x20);
    local_2a48._4_4_ = iStack_13f0 + iStack_1444;
    local_2a48._0_4_ = iStack_13f4 + local_1448;
    local_2a48._8_4_ = iStack_13ec + iStack_1440;
    local_2a48._12_4_ = local_13f8 + iStack_143c;
    piVar3 = (int *)(in_RSI + 0x10 + local_2a28 * 0x40);
    *piVar3 = iStack_13f4 + local_1448;
    piVar3[1] = iStack_13f0 + iStack_1444;
    piVar3[2] = iStack_13ec + iStack_1440;
    piVar3[3] = local_13f8 + iStack_143c;
    local_1468 = (int)uVar6;
    iStack_1464 = (int)(uVar6 >> 0x20);
    iStack_1460 = (int)uVar37;
    iStack_145c = (int)(uVar37 >> 0x20);
    local_2a58._4_4_ = iStack_13cc + iStack_1464;
    local_2a58._0_4_ = iStack_13d0 + local_1468;
    local_2a58._8_4_ = local_13d8 + iStack_1460;
    local_2a58._12_4_ = iStack_13d4 + iStack_145c;
    piVar3 = (int *)(in_RSI + 0x20 + local_2a28 * 0x40);
    *piVar3 = iStack_13d0 + local_1468;
    piVar3[1] = iStack_13cc + iStack_1464;
    piVar3[2] = local_13d8 + iStack_1460;
    piVar3[3] = iStack_13d4 + iStack_145c;
    local_2a68._4_4_ = local_13b8 + iStack_1024;
    local_2a68._0_4_ = iStack_13ac + local_1028;
    local_2a68._8_4_ = iStack_13b4 + iStack_1020;
    local_2a68._12_4_ = iStack_13b0 + iStack_101c;
    piVar3 = (int *)(in_RSI + 0x30 + local_2a28 * 0x40);
    *piVar3 = iStack_13ac + local_1028;
    piVar3[1] = local_13b8 + iStack_1024;
    piVar3[2] = iStack_13b4 + iStack_1020;
    piVar3[3] = iStack_13b0 + iStack_101c;
    puVar2 = (ulong *)(in_RDI + 0x40 + local_2a28 * 0x80);
    local_2a38 = local_2a38 ^ *puVar2;
    uStack_2a30 = uStack_2a30 ^ puVar2[1];
    puVar2 = (ulong *)(in_RDI + 0x50 + local_2a28 * 0x80);
    uVar5 = local_2a48._0_8_ ^ *puVar2;
    uVar36 = local_2a48._8_8_ ^ puVar2[1];
    puVar2 = (ulong *)(in_RDI + 0x60 + local_2a28 * 0x80);
    uVar6 = local_2a58._0_8_ ^ *puVar2;
    uVar37 = local_2a58._8_8_ ^ puVar2[1];
    puVar2 = (ulong *)(in_RDI + 0x70 + local_2a28 * 0x80);
    local_2a68._0_8_ = local_2a68._0_8_ ^ *puVar2;
    local_2a68._8_8_ = local_2a68._8_8_ ^ puVar2[1];
    local_1498 = (int)local_2a38;
    iStack_1494 = (int)(local_2a38 >> 0x20);
    iStack_1490 = (int)uStack_2a30;
    iStack_148c = (int)(uStack_2a30 >> 0x20);
    local_14a8 = (int)local_2a68._0_8_;
    iStack_14a4 = (int)((ulong)local_2a68._0_8_ >> 0x20);
    iStack_14a0 = (int)local_2a68._8_8_;
    iStack_149c = (int)((ulong)local_2a68._8_8_ >> 0x20);
    uVar7 = uVar5 ^ CONCAT44(iStack_1494 + iStack_14a4,(local_1498 + local_14a8) * 0x80) ^
            CONCAT44((uint)(iStack_1494 + iStack_14a4) >> 0x19,
                     (uint)(local_1498 + local_14a8) >> 0x19);
    uVar38 = uVar36 ^ CONCAT44(iStack_148c + iStack_149c,iStack_1490 + iStack_14a0) ^
             CONCAT44((uint)(iStack_148c + iStack_149c) >> 0x19,
                      (uint)(iStack_1490 + iStack_14a0) >> 0x19);
    local_14b8 = (int)uVar7;
    iStack_14b4 = (int)(uVar7 >> 0x20);
    iStack_14b0 = (int)uVar38;
    iStack_14ac = (int)(uVar38 >> 0x20);
    uVar7 = uVar6 ^ CONCAT44(iStack_14b4 + iStack_1494,(local_14b8 + local_1498) * 0x200) ^
            CONCAT44((uint)(iStack_14b4 + iStack_1494) >> 0x17,
                     (uint)(local_14b8 + local_1498) >> 0x17);
    uVar39 = uVar37 ^ CONCAT44(iStack_14ac + iStack_148c,iStack_14b0 + iStack_1490) ^
             CONCAT44((uint)(iStack_14ac + iStack_148c) >> 0x17,
                      (uint)(iStack_14b0 + iStack_1490) >> 0x17);
    local_14d8 = (int)uVar7;
    iStack_14d4 = (int)(uVar7 >> 0x20);
    iStack_14d0 = (int)uVar39;
    iStack_14cc = (int)(uVar39 >> 0x20);
    local_2a68._0_8_ =
         local_2a68._0_8_ ^ CONCAT44(iStack_14d4 + iStack_14b4,(local_14d8 + local_14b8) * 0x2000) ^
         CONCAT44((uint)(iStack_14d4 + iStack_14b4) >> 0x13,(uint)(local_14d8 + local_14b8) >> 0x13)
    ;
    local_2a68._8_8_ =
         local_2a68._8_8_ ^ CONCAT44(iStack_14cc + iStack_14ac,iStack_14d0 + iStack_14b0) ^
         CONCAT44((uint)(iStack_14cc + iStack_14ac) >> 0x13,
                  (uint)(iStack_14d0 + iStack_14b0) >> 0x13);
    local_14f8 = (int)local_2a68._0_8_;
    iStack_14f4 = (int)((ulong)local_2a68._0_8_ >> 0x20);
    iStack_14f0 = (int)local_2a68._8_8_;
    iStack_14ec = (int)((ulong)local_2a68._8_8_ >> 0x20);
    uVar7 = local_2a38 ^ CONCAT44(iStack_14f4 + iStack_14d4,(local_14f8 + local_14d8) * 0x40000) ^
            CONCAT44((uint)(iStack_14f4 + iStack_14d4) >> 0xe,(uint)(local_14f8 + local_14d8) >> 0xe
                    );
    uVar40 = uStack_2a30 ^ CONCAT44(iStack_14ec + iStack_14cc,iStack_14f0 + iStack_14d0) ^
             CONCAT44((uint)(iStack_14ec + iStack_14cc) >> 0xe,
                      (uint)(iStack_14f0 + iStack_14d0) >> 0xe);
    local_2a48._4_4_ = local_14b8;
    local_2a48._0_4_ = iStack_14ac;
    local_2a48._8_4_ = iStack_14b4;
    local_2a48._12_4_ = iStack_14b0;
    auVar22._8_4_ = local_14d8;
    auVar22._0_8_ = uVar39;
    auVar22._12_4_ = iStack_14d4;
    auVar23._0_12_ = local_2a68._4_12_;
    auVar23._12_4_ = local_14f8;
    local_1518 = (int)uVar7;
    iStack_1514 = (int)(uVar7 >> 0x20);
    iStack_1510 = (int)uVar40;
    iStack_150c = (int)(uVar40 >> 0x20);
    local_2a68._0_8_ = local_2a68._4_8_;
    local_2a68._8_8_ = auVar23._8_8_;
    uVar38 = local_2a68._0_8_ ^ CONCAT44(iStack_1514 + local_14b8,(local_1518 + iStack_14ac) * 0x80)
             ^ CONCAT44((uint)(iStack_1514 + local_14b8) >> 0x19,
                        (uint)(local_1518 + iStack_14ac) >> 0x19);
    uVar41 = local_2a68._8_8_ ^ CONCAT44(iStack_150c + iStack_14b0,iStack_1510 + iStack_14b4) ^
             CONCAT44((uint)(iStack_150c + iStack_14b0) >> 0x19,
                      (uint)(iStack_1510 + iStack_14b4) >> 0x19);
    local_1538 = (int)uVar38;
    iStack_1534 = (int)(uVar38 >> 0x20);
    iStack_1530 = (int)uVar41;
    iStack_152c = (int)(uVar41 >> 0x20);
    local_2a58._8_8_ = auVar22._8_8_;
    uVar38 = uVar39 ^ CONCAT44(iStack_1534 + iStack_1514,(local_1538 + local_1518) * 0x200) ^
             CONCAT44((uint)(iStack_1534 + iStack_1514) >> 0x17,
                      (uint)(local_1538 + local_1518) >> 0x17);
    uVar39 = local_2a58._8_8_ ^ CONCAT44(iStack_152c + iStack_150c,iStack_1530 + iStack_1510) ^
             CONCAT44((uint)(iStack_152c + iStack_150c) >> 0x17,
                      (uint)(iStack_1530 + iStack_1510) >> 0x17);
    local_1558 = (int)uVar38;
    iStack_1554 = (int)(uVar38 >> 0x20);
    iStack_1550 = (int)uVar39;
    iStack_154c = (int)(uVar39 >> 0x20);
    local_2a48._0_8_ =
         local_2a48._0_8_ ^ CONCAT44(iStack_1554 + iStack_1534,(local_1558 + local_1538) * 0x2000) ^
         CONCAT44((uint)(iStack_1554 + iStack_1534) >> 0x13,(uint)(local_1558 + local_1538) >> 0x13)
    ;
    local_2a48._8_8_ =
         local_2a48._8_8_ ^ CONCAT44(iStack_154c + iStack_152c,iStack_1550 + iStack_1530) ^
         CONCAT44((uint)(iStack_154c + iStack_152c) >> 0x13,
                  (uint)(iStack_1550 + iStack_1530) >> 0x13);
    local_1578 = (int)local_2a48._0_8_;
    iStack_1574 = (int)((ulong)local_2a48._0_8_ >> 0x20);
    iStack_1570 = (int)local_2a48._8_8_;
    iStack_156c = (int)((ulong)local_2a48._8_8_ >> 0x20);
    uVar7 = uVar7 ^ CONCAT44(iStack_1574 + iStack_1554,(local_1578 + local_1558) * 0x40000) ^
            CONCAT44((uint)(iStack_1574 + iStack_1554) >> 0xe,(uint)(local_1578 + local_1558) >> 0xe
                    );
    uVar40 = uVar40 ^ CONCAT44(iStack_156c + iStack_154c,iStack_1570 + iStack_1550) ^
             CONCAT44((uint)(iStack_156c + iStack_154c) >> 0xe,
                      (uint)(iStack_1570 + iStack_1550) >> 0xe);
    auVar24._0_12_ = local_2a48._4_12_;
    auVar24._12_4_ = local_1578;
    auVar25._8_4_ = local_1558;
    auVar25._0_8_ = uVar39;
    auVar25._12_4_ = iStack_1554;
    local_2a68._4_4_ = local_1538;
    local_2a68._0_4_ = iStack_152c;
    local_2a68._8_4_ = iStack_1534;
    local_2a68._12_4_ = iStack_1530;
    local_1598 = (int)uVar7;
    iStack_1594 = (int)(uVar7 >> 0x20);
    iStack_1590 = (int)uVar40;
    iStack_158c = (int)(uVar40 >> 0x20);
    local_2a48._0_8_ = local_2a48._4_8_;
    local_2a48._8_8_ = auVar24._8_8_;
    uVar38 = local_2a48._0_8_ ^ CONCAT44(iStack_1594 + local_1538,(local_1598 + iStack_152c) * 0x80)
             ^ CONCAT44((uint)(iStack_1594 + local_1538) >> 0x19,
                        (uint)(local_1598 + iStack_152c) >> 0x19);
    uVar41 = local_2a48._8_8_ ^ CONCAT44(iStack_158c + iStack_1530,iStack_1590 + iStack_1534) ^
             CONCAT44((uint)(iStack_158c + iStack_1530) >> 0x19,
                      (uint)(iStack_1590 + iStack_1534) >> 0x19);
    local_15b8 = (int)uVar38;
    iStack_15b4 = (int)(uVar38 >> 0x20);
    iStack_15b0 = (int)uVar41;
    iStack_15ac = (int)(uVar41 >> 0x20);
    local_2a58._8_8_ = auVar25._8_8_;
    uVar38 = uVar39 ^ CONCAT44(iStack_15b4 + iStack_1594,(local_15b8 + local_1598) * 0x200) ^
             CONCAT44((uint)(iStack_15b4 + iStack_1594) >> 0x17,
                      (uint)(local_15b8 + local_1598) >> 0x17);
    uVar39 = local_2a58._8_8_ ^ CONCAT44(iStack_15ac + iStack_158c,iStack_15b0 + iStack_1590) ^
             CONCAT44((uint)(iStack_15ac + iStack_158c) >> 0x17,
                      (uint)(iStack_15b0 + iStack_1590) >> 0x17);
    local_15d8 = (int)uVar38;
    iStack_15d4 = (int)(uVar38 >> 0x20);
    iStack_15d0 = (int)uVar39;
    iStack_15cc = (int)(uVar39 >> 0x20);
    local_2a68._0_8_ =
         local_2a68._0_8_ ^ CONCAT44(iStack_15d4 + iStack_15b4,(local_15d8 + local_15b8) * 0x2000) ^
         CONCAT44((uint)(iStack_15d4 + iStack_15b4) >> 0x13,(uint)(local_15d8 + local_15b8) >> 0x13)
    ;
    local_2a68._8_8_ =
         local_2a68._8_8_ ^ CONCAT44(iStack_15cc + iStack_15ac,iStack_15d0 + iStack_15b0) ^
         CONCAT44((uint)(iStack_15cc + iStack_15ac) >> 0x13,
                  (uint)(iStack_15d0 + iStack_15b0) >> 0x13);
    local_15f8 = (int)local_2a68._0_8_;
    iStack_15f4 = (int)((ulong)local_2a68._0_8_ >> 0x20);
    iStack_15f0 = (int)local_2a68._8_8_;
    iStack_15ec = (int)((ulong)local_2a68._8_8_ >> 0x20);
    uVar7 = uVar7 ^ CONCAT44(iStack_15f4 + iStack_15d4,(local_15f8 + local_15d8) * 0x40000) ^
            CONCAT44((uint)(iStack_15f4 + iStack_15d4) >> 0xe,(uint)(local_15f8 + local_15d8) >> 0xe
                    );
    uVar40 = uVar40 ^ CONCAT44(iStack_15ec + iStack_15cc,iStack_15f0 + iStack_15d0) ^
             CONCAT44((uint)(iStack_15ec + iStack_15cc) >> 0xe,
                      (uint)(iStack_15f0 + iStack_15d0) >> 0xe);
    local_2a48._4_4_ = local_15b8;
    local_2a48._0_4_ = iStack_15ac;
    local_2a48._8_4_ = iStack_15b4;
    local_2a48._12_4_ = iStack_15b0;
    auVar26._8_4_ = local_15d8;
    auVar26._0_8_ = uVar39;
    auVar26._12_4_ = iStack_15d4;
    auVar27._0_12_ = local_2a68._4_12_;
    auVar27._12_4_ = local_15f8;
    local_1618 = (int)uVar7;
    iStack_1614 = (int)(uVar7 >> 0x20);
    iStack_1610 = (int)uVar40;
    iStack_160c = (int)(uVar40 >> 0x20);
    local_2a68._0_8_ = local_2a68._4_8_;
    local_2a68._8_8_ = auVar27._8_8_;
    uVar38 = local_2a68._0_8_ ^ CONCAT44(iStack_1614 + local_15b8,(local_1618 + iStack_15ac) * 0x80)
             ^ CONCAT44((uint)(iStack_1614 + local_15b8) >> 0x19,
                        (uint)(local_1618 + iStack_15ac) >> 0x19);
    uVar41 = local_2a68._8_8_ ^ CONCAT44(iStack_160c + iStack_15b0,iStack_1610 + iStack_15b4) ^
             CONCAT44((uint)(iStack_160c + iStack_15b0) >> 0x19,
                      (uint)(iStack_1610 + iStack_15b4) >> 0x19);
    local_1638 = (int)uVar38;
    iStack_1634 = (int)(uVar38 >> 0x20);
    iStack_1630 = (int)uVar41;
    iStack_162c = (int)(uVar41 >> 0x20);
    local_2a58._8_8_ = auVar26._8_8_;
    uVar38 = uVar39 ^ CONCAT44(iStack_1634 + iStack_1614,(local_1638 + local_1618) * 0x200) ^
             CONCAT44((uint)(iStack_1634 + iStack_1614) >> 0x17,
                      (uint)(local_1638 + local_1618) >> 0x17);
    uVar39 = local_2a58._8_8_ ^ CONCAT44(iStack_162c + iStack_160c,iStack_1630 + iStack_1610) ^
             CONCAT44((uint)(iStack_162c + iStack_160c) >> 0x17,
                      (uint)(iStack_1630 + iStack_1610) >> 0x17);
    local_1658 = (int)uVar38;
    iStack_1654 = (int)(uVar38 >> 0x20);
    iStack_1650 = (int)uVar39;
    iStack_164c = (int)(uVar39 >> 0x20);
    local_2a48._0_8_ =
         local_2a48._0_8_ ^ CONCAT44(iStack_1654 + iStack_1634,(local_1658 + local_1638) * 0x2000) ^
         CONCAT44((uint)(iStack_1654 + iStack_1634) >> 0x13,(uint)(local_1658 + local_1638) >> 0x13)
    ;
    local_2a48._8_8_ =
         local_2a48._8_8_ ^ CONCAT44(iStack_164c + iStack_162c,iStack_1650 + iStack_1630) ^
         CONCAT44((uint)(iStack_164c + iStack_162c) >> 0x13,
                  (uint)(iStack_1650 + iStack_1630) >> 0x13);
    local_1678 = (int)local_2a48._0_8_;
    iStack_1674 = (int)((ulong)local_2a48._0_8_ >> 0x20);
    iStack_1670 = (int)local_2a48._8_8_;
    iStack_166c = (int)((ulong)local_2a48._8_8_ >> 0x20);
    uVar7 = uVar7 ^ CONCAT44(iStack_1674 + iStack_1654,(local_1678 + local_1658) * 0x40000) ^
            CONCAT44((uint)(iStack_1674 + iStack_1654) >> 0xe,(uint)(local_1678 + local_1658) >> 0xe
                    );
    uVar40 = uVar40 ^ CONCAT44(iStack_166c + iStack_164c,iStack_1670 + iStack_1650) ^
             CONCAT44((uint)(iStack_166c + iStack_164c) >> 0xe,
                      (uint)(iStack_1670 + iStack_1650) >> 0xe);
    auVar28._0_12_ = local_2a48._4_12_;
    auVar28._12_4_ = local_1678;
    auVar29._8_4_ = local_1658;
    auVar29._0_8_ = uVar39;
    auVar29._12_4_ = iStack_1654;
    local_2a68._4_4_ = local_1638;
    local_2a68._0_4_ = iStack_162c;
    local_2a68._8_4_ = iStack_1634;
    local_2a68._12_4_ = iStack_1630;
    local_1698 = (int)uVar7;
    iStack_1694 = (int)(uVar7 >> 0x20);
    iStack_1690 = (int)uVar40;
    iStack_168c = (int)(uVar40 >> 0x20);
    local_2a48._0_8_ = local_2a48._4_8_;
    local_2a48._8_8_ = auVar28._8_8_;
    uVar38 = local_2a48._0_8_ ^ CONCAT44(iStack_1694 + local_1638,(local_1698 + iStack_162c) * 0x80)
             ^ CONCAT44((uint)(iStack_1694 + local_1638) >> 0x19,
                        (uint)(local_1698 + iStack_162c) >> 0x19);
    uVar41 = local_2a48._8_8_ ^ CONCAT44(iStack_168c + iStack_1630,iStack_1690 + iStack_1634) ^
             CONCAT44((uint)(iStack_168c + iStack_1630) >> 0x19,
                      (uint)(iStack_1690 + iStack_1634) >> 0x19);
    local_16b8 = (int)uVar38;
    iStack_16b4 = (int)(uVar38 >> 0x20);
    iStack_16b0 = (int)uVar41;
    iStack_16ac = (int)(uVar41 >> 0x20);
    local_2a58._8_8_ = auVar29._8_8_;
    uVar38 = uVar39 ^ CONCAT44(iStack_16b4 + iStack_1694,(local_16b8 + local_1698) * 0x200) ^
             CONCAT44((uint)(iStack_16b4 + iStack_1694) >> 0x17,
                      (uint)(local_16b8 + local_1698) >> 0x17);
    uVar39 = local_2a58._8_8_ ^ CONCAT44(iStack_16ac + iStack_168c,iStack_16b0 + iStack_1690) ^
             CONCAT44((uint)(iStack_16ac + iStack_168c) >> 0x17,
                      (uint)(iStack_16b0 + iStack_1690) >> 0x17);
    local_16d8 = (int)uVar38;
    iStack_16d4 = (int)(uVar38 >> 0x20);
    iStack_16d0 = (int)uVar39;
    iStack_16cc = (int)(uVar39 >> 0x20);
    local_2a68._0_8_ =
         local_2a68._0_8_ ^ CONCAT44(iStack_16d4 + iStack_16b4,(local_16d8 + local_16b8) * 0x2000) ^
         CONCAT44((uint)(iStack_16d4 + iStack_16b4) >> 0x13,(uint)(local_16d8 + local_16b8) >> 0x13)
    ;
    local_2a68._8_8_ =
         local_2a68._8_8_ ^ CONCAT44(iStack_16cc + iStack_16ac,iStack_16d0 + iStack_16b0) ^
         CONCAT44((uint)(iStack_16cc + iStack_16ac) >> 0x13,
                  (uint)(iStack_16d0 + iStack_16b0) >> 0x13);
    local_16f8 = (int)local_2a68._0_8_;
    iStack_16f4 = (int)((ulong)local_2a68._0_8_ >> 0x20);
    iStack_16f0 = (int)local_2a68._8_8_;
    iStack_16ec = (int)((ulong)local_2a68._8_8_ >> 0x20);
    uVar7 = uVar7 ^ CONCAT44(iStack_16f4 + iStack_16d4,(local_16f8 + local_16d8) * 0x40000) ^
            CONCAT44((uint)(iStack_16f4 + iStack_16d4) >> 0xe,(uint)(local_16f8 + local_16d8) >> 0xe
                    );
    uVar40 = uVar40 ^ CONCAT44(iStack_16ec + iStack_16cc,iStack_16f0 + iStack_16d0) ^
             CONCAT44((uint)(iStack_16ec + iStack_16cc) >> 0xe,
                      (uint)(iStack_16f0 + iStack_16d0) >> 0xe);
    local_2a48._4_4_ = local_16b8;
    local_2a48._0_4_ = iStack_16ac;
    local_2a48._8_4_ = iStack_16b4;
    local_2a48._12_4_ = iStack_16b0;
    auVar30._8_4_ = local_16d8;
    auVar30._0_8_ = uVar39;
    auVar30._12_4_ = iStack_16d4;
    auVar31._0_12_ = local_2a68._4_12_;
    auVar31._12_4_ = local_16f8;
    local_1718 = (int)uVar7;
    iStack_1714 = (int)(uVar7 >> 0x20);
    iStack_1710 = (int)uVar40;
    iStack_170c = (int)(uVar40 >> 0x20);
    local_2a68._0_8_ = local_2a68._4_8_;
    local_2a68._8_8_ = auVar31._8_8_;
    uVar38 = local_2a68._0_8_ ^ CONCAT44(iStack_1714 + local_16b8,(local_1718 + iStack_16ac) * 0x80)
             ^ CONCAT44((uint)(iStack_1714 + local_16b8) >> 0x19,
                        (uint)(local_1718 + iStack_16ac) >> 0x19);
    uVar41 = local_2a68._8_8_ ^ CONCAT44(iStack_170c + iStack_16b0,iStack_1710 + iStack_16b4) ^
             CONCAT44((uint)(iStack_170c + iStack_16b0) >> 0x19,
                      (uint)(iStack_1710 + iStack_16b4) >> 0x19);
    local_1738 = (int)uVar38;
    iStack_1734 = (int)(uVar38 >> 0x20);
    iStack_1730 = (int)uVar41;
    iStack_172c = (int)(uVar41 >> 0x20);
    local_2a58._8_8_ = auVar30._8_8_;
    uVar38 = uVar39 ^ CONCAT44(iStack_1734 + iStack_1714,(local_1738 + local_1718) * 0x200) ^
             CONCAT44((uint)(iStack_1734 + iStack_1714) >> 0x17,
                      (uint)(local_1738 + local_1718) >> 0x17);
    uVar39 = local_2a58._8_8_ ^ CONCAT44(iStack_172c + iStack_170c,iStack_1730 + iStack_1710) ^
             CONCAT44((uint)(iStack_172c + iStack_170c) >> 0x17,
                      (uint)(iStack_1730 + iStack_1710) >> 0x17);
    local_1758 = (int)uVar38;
    iStack_1754 = (int)(uVar38 >> 0x20);
    iStack_1750 = (int)uVar39;
    iStack_174c = (int)(uVar39 >> 0x20);
    local_2a48._0_8_ =
         local_2a48._0_8_ ^ CONCAT44(iStack_1754 + iStack_1734,(local_1758 + local_1738) * 0x2000) ^
         CONCAT44((uint)(iStack_1754 + iStack_1734) >> 0x13,(uint)(local_1758 + local_1738) >> 0x13)
    ;
    local_2a48._8_8_ =
         local_2a48._8_8_ ^ CONCAT44(iStack_174c + iStack_172c,iStack_1750 + iStack_1730) ^
         CONCAT44((uint)(iStack_174c + iStack_172c) >> 0x13,
                  (uint)(iStack_1750 + iStack_1730) >> 0x13);
    local_1778 = (int)local_2a48._0_8_;
    iStack_1774 = (int)((ulong)local_2a48._0_8_ >> 0x20);
    iStack_1770 = (int)local_2a48._8_8_;
    iStack_176c = (int)((ulong)local_2a48._8_8_ >> 0x20);
    uVar7 = uVar7 ^ CONCAT44(iStack_1774 + iStack_1754,(local_1778 + local_1758) * 0x40000) ^
            CONCAT44((uint)(iStack_1774 + iStack_1754) >> 0xe,(uint)(local_1778 + local_1758) >> 0xe
                    );
    uVar40 = uVar40 ^ CONCAT44(iStack_176c + iStack_174c,iStack_1770 + iStack_1750) ^
             CONCAT44((uint)(iStack_176c + iStack_174c) >> 0xe,
                      (uint)(iStack_1770 + iStack_1750) >> 0xe);
    auVar32._0_12_ = local_2a48._4_12_;
    auVar32._12_4_ = local_1778;
    auVar33._8_4_ = local_1758;
    auVar33._0_8_ = uVar39;
    auVar33._12_4_ = iStack_1754;
    local_2a68._4_4_ = local_1738;
    local_2a68._0_4_ = iStack_172c;
    local_2a68._8_4_ = iStack_1734;
    local_2a68._12_4_ = iStack_1730;
    local_1798 = (int)uVar7;
    iStack_1794 = (int)(uVar7 >> 0x20);
    iStack_1790 = (int)uVar40;
    iStack_178c = (int)(uVar40 >> 0x20);
    local_2a48._0_8_ = local_2a48._4_8_;
    local_2a48._8_8_ = auVar32._8_8_;
    uVar38 = local_2a48._0_8_ ^ CONCAT44(iStack_1794 + local_1738,(local_1798 + iStack_172c) * 0x80)
             ^ CONCAT44((uint)(iStack_1794 + local_1738) >> 0x19,
                        (uint)(local_1798 + iStack_172c) >> 0x19);
    uVar41 = local_2a48._8_8_ ^ CONCAT44(iStack_178c + iStack_1730,iStack_1790 + iStack_1734) ^
             CONCAT44((uint)(iStack_178c + iStack_1730) >> 0x19,
                      (uint)(iStack_1790 + iStack_1734) >> 0x19);
    local_17b8 = (int)uVar38;
    iStack_17b4 = (int)(uVar38 >> 0x20);
    iStack_17b0 = (int)uVar41;
    iStack_17ac = (int)(uVar41 >> 0x20);
    local_2a58._8_8_ = auVar33._8_8_;
    uVar38 = uVar39 ^ CONCAT44(iStack_17b4 + iStack_1794,(local_17b8 + local_1798) * 0x200) ^
             CONCAT44((uint)(iStack_17b4 + iStack_1794) >> 0x17,
                      (uint)(local_17b8 + local_1798) >> 0x17);
    uVar39 = local_2a58._8_8_ ^ CONCAT44(iStack_17ac + iStack_178c,iStack_17b0 + iStack_1790) ^
             CONCAT44((uint)(iStack_17ac + iStack_178c) >> 0x17,
                      (uint)(iStack_17b0 + iStack_1790) >> 0x17);
    local_17d8 = (int)uVar38;
    iStack_17d4 = (int)(uVar38 >> 0x20);
    iStack_17d0 = (int)uVar39;
    iStack_17cc = (int)(uVar39 >> 0x20);
    local_2a68._0_8_ =
         local_2a68._0_8_ ^ CONCAT44(iStack_17d4 + iStack_17b4,(local_17d8 + local_17b8) * 0x2000) ^
         CONCAT44((uint)(iStack_17d4 + iStack_17b4) >> 0x13,(uint)(local_17d8 + local_17b8) >> 0x13)
    ;
    local_2a68._8_8_ =
         local_2a68._8_8_ ^ CONCAT44(iStack_17cc + iStack_17ac,iStack_17d0 + iStack_17b0) ^
         CONCAT44((uint)(iStack_17cc + iStack_17ac) >> 0x13,
                  (uint)(iStack_17d0 + iStack_17b0) >> 0x13);
    local_17f8 = (int)local_2a68._0_8_;
    iStack_17f4 = (int)((ulong)local_2a68._0_8_ >> 0x20);
    iStack_17f0 = (int)local_2a68._8_8_;
    iStack_17ec = (int)((ulong)local_2a68._8_8_ >> 0x20);
    uVar7 = uVar7 ^ CONCAT44(iStack_17f4 + iStack_17d4,(local_17f8 + local_17d8) * 0x40000) ^
            CONCAT44((uint)(iStack_17f4 + iStack_17d4) >> 0xe,(uint)(local_17f8 + local_17d8) >> 0xe
                    );
    uVar40 = uVar40 ^ CONCAT44(iStack_17ec + iStack_17cc,iStack_17f0 + iStack_17d0) ^
             CONCAT44((uint)(iStack_17ec + iStack_17cc) >> 0xe,
                      (uint)(iStack_17f0 + iStack_17d0) >> 0xe);
    local_2a48._4_4_ = local_17b8;
    local_2a48._0_4_ = iStack_17ac;
    local_2a48._8_4_ = iStack_17b4;
    local_2a48._12_4_ = iStack_17b0;
    auVar34._8_4_ = local_17d8;
    auVar34._0_8_ = uVar39;
    auVar34._12_4_ = iStack_17d4;
    auVar35._0_12_ = local_2a68._4_12_;
    auVar35._12_4_ = local_17f8;
    local_1818 = (int)uVar7;
    iStack_1814 = (int)(uVar7 >> 0x20);
    iStack_1810 = (int)uVar40;
    iStack_180c = (int)(uVar40 >> 0x20);
    local_2a68._0_8_ = local_2a68._4_8_;
    local_2a68._8_8_ = auVar35._8_8_;
    uVar38 = local_2a68._0_8_ ^ CONCAT44(iStack_1814 + local_17b8,(local_1818 + iStack_17ac) * 0x80)
             ^ CONCAT44((uint)(iStack_1814 + local_17b8) >> 0x19,
                        (uint)(local_1818 + iStack_17ac) >> 0x19);
    uVar41 = local_2a68._8_8_ ^ CONCAT44(iStack_180c + iStack_17b0,iStack_1810 + iStack_17b4) ^
             CONCAT44((uint)(iStack_180c + iStack_17b0) >> 0x19,
                      (uint)(iStack_1810 + iStack_17b4) >> 0x19);
    local_1838 = (int)uVar38;
    iStack_1834 = (int)(uVar38 >> 0x20);
    iStack_1830 = (int)uVar41;
    iStack_182c = (int)(uVar41 >> 0x20);
    local_2a58._8_8_ = auVar34._8_8_;
    uVar38 = uVar39 ^ CONCAT44(iStack_1834 + iStack_1814,(local_1838 + local_1818) * 0x200) ^
             CONCAT44((uint)(iStack_1834 + iStack_1814) >> 0x17,
                      (uint)(local_1838 + local_1818) >> 0x17);
    uVar39 = local_2a58._8_8_ ^ CONCAT44(iStack_182c + iStack_180c,iStack_1830 + iStack_1810) ^
             CONCAT44((uint)(iStack_182c + iStack_180c) >> 0x17,
                      (uint)(iStack_1830 + iStack_1810) >> 0x17);
    local_1858 = (int)uVar38;
    iStack_1854 = (int)(uVar38 >> 0x20);
    iStack_1850 = (int)uVar39;
    iStack_184c = (int)(uVar39 >> 0x20);
    uVar38 = local_2a48._0_8_ ^
             CONCAT44(iStack_1854 + iStack_1834,(local_1858 + local_1838) * 0x2000) ^
             CONCAT44((uint)(iStack_1854 + iStack_1834) >> 0x13,
                      (uint)(local_1858 + local_1838) >> 0x13);
    uVar39 = local_2a48._8_8_ ^ CONCAT44(iStack_184c + iStack_182c,iStack_1850 + iStack_1830) ^
             CONCAT44((uint)(iStack_184c + iStack_182c) >> 0x13,
                      (uint)(iStack_1850 + iStack_1830) >> 0x13);
    local_1878 = (int)uVar38;
    iStack_1874 = (int)(uVar38 >> 0x20);
    iStack_1870 = (int)uVar39;
    iStack_186c = (int)(uVar39 >> 0x20);
    uVar7 = uVar7 ^ CONCAT44(iStack_1874 + iStack_1854,(local_1878 + local_1858) * 0x40000) ^
            CONCAT44((uint)(iStack_1874 + iStack_1854) >> 0xe,(uint)(local_1878 + local_1858) >> 0xe
                    );
    uVar38 = uVar40 ^ CONCAT44(iStack_186c + iStack_184c,iStack_1870 + iStack_1850) ^
             CONCAT44((uint)(iStack_186c + iStack_184c) >> 0xe,
                      (uint)(iStack_1870 + iStack_1850) >> 0xe);
    local_1898 = (int)uVar7;
    iStack_1894 = (int)(uVar7 >> 0x20);
    iStack_1890 = (int)uVar38;
    iStack_188c = (int)(uVar38 >> 0x20);
    local_2a38 = CONCAT44(iStack_1894 + iStack_1494,local_1898 + local_1498);
    uStack_2a30 = CONCAT44(iStack_188c + iStack_148c,iStack_1890 + iStack_1490);
    piVar3 = (int *)(in_RSI + (in_RDX + local_2a28) * 0x40);
    *piVar3 = local_1898 + local_1498;
    piVar3[1] = iStack_1894 + iStack_1494;
    piVar3[2] = iStack_1890 + iStack_1490;
    piVar3[3] = iStack_188c + iStack_148c;
    local_18c8 = (int)uVar5;
    iStack_18c4 = (int)(uVar5 >> 0x20);
    iStack_18c0 = (int)uVar36;
    iStack_18bc = (int)(uVar36 >> 0x20);
    local_2a48._4_4_ = iStack_1870 + iStack_18c4;
    local_2a48._0_4_ = iStack_1874 + local_18c8;
    local_2a48._8_4_ = iStack_186c + iStack_18c0;
    local_2a48._12_4_ = local_1878 + iStack_18bc;
    lVar4 = in_RSI + (in_RDX + local_2a28) * 0x40;
    *(int *)(lVar4 + 0x10) = iStack_1874 + local_18c8;
    *(int *)(lVar4 + 0x14) = iStack_1870 + iStack_18c4;
    *(int *)(lVar4 + 0x18) = iStack_186c + iStack_18c0;
    *(int *)(lVar4 + 0x1c) = local_1878 + iStack_18bc;
    local_18e8 = (int)uVar6;
    iStack_18e4 = (int)(uVar6 >> 0x20);
    iStack_18e0 = (int)uVar37;
    iStack_18dc = (int)(uVar37 >> 0x20);
    local_2a58._4_4_ = iStack_184c + iStack_18e4;
    local_2a58._0_4_ = iStack_1850 + local_18e8;
    local_2a58._8_4_ = local_1858 + iStack_18e0;
    local_2a58._12_4_ = iStack_1854 + iStack_18dc;
    lVar4 = in_RSI + (in_RDX + local_2a28) * 0x40;
    *(int *)(lVar4 + 0x20) = iStack_1850 + local_18e8;
    *(int *)(lVar4 + 0x24) = iStack_184c + iStack_18e4;
    *(int *)(lVar4 + 0x28) = local_1858 + iStack_18e0;
    *(int *)(lVar4 + 0x2c) = iStack_1854 + iStack_18dc;
    local_2a68._4_4_ = local_1838 + iStack_14a4;
    local_2a68._0_4_ = iStack_182c + local_14a8;
    local_2a68._8_4_ = iStack_1834 + iStack_14a0;
    local_2a68._12_4_ = iStack_1830 + iStack_149c;
    lVar4 = in_RSI + (in_RDX + local_2a28) * 0x40;
    *(int *)(lVar4 + 0x30) = iStack_182c + local_14a8;
    *(int *)(lVar4 + 0x34) = local_1838 + iStack_14a4;
    *(int *)(lVar4 + 0x38) = iStack_1834 + iStack_14a0;
    *(int *)(lVar4 + 0x3c) = iStack_1830 + iStack_149c;
  }
  return;
}

Assistant:

static void
blockmix_salsa8(const salsa20_blk_t *restrict Bin,
    salsa20_blk_t *restrict Bout, size_t r)
{
	size_t i;
	__m128i X0, X1, X2, X3;

	r--;
	PREFETCH(&Bin[r * 2 + 1], _MM_HINT_T0)
	for (i = 0; i < r; i++) {
		PREFETCH(&Bin[i * 2], _MM_HINT_T0)
		PREFETCH(&Bin[i * 2 + 1], _MM_HINT_T0)
	}
	PREFETCH(&Bin[r * 2], _MM_HINT_T0)

	/* 1: X <-- B_{2r - 1} */
	X0 = Bin[r * 2 + 1].q[0];
	X1 = Bin[r * 2 + 1].q[1];
	X2 = Bin[r * 2 + 1].q[2];
	X3 = Bin[r * 2 + 1].q[3];

	/* 2: for i = 0 to 2r - 1 do */
	for (i = 0; i <= r; i++) {
		/* 3: X <-- H(X \xor B_i) */
		/* 4: Y_i <-- X */
		/* 6: B' <-- (Y_0, Y_2 ... Y_{2r-2}, Y_1, Y_3 ... Y_{2r-1}) */
		SALSA20_8_XOR_MEM(Bin[i * 2].q, Bout[i].q)

		/* 3: X <-- H(X \xor B_i) */
		/* 4: Y_i <-- X */
		/* 6: B' <-- (Y_0, Y_2 ... Y_{2r-2}, Y_1, Y_3 ... Y_{2r-1}) */
		SALSA20_8_XOR_MEM(Bin[i * 2 + 1].q, Bout[r + 1 + i].q)
	}
}